

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_sort.cpp
# Opt level: O3

void duckdb::SinkDataChunk
               (Vector *child_vector,SelectionVector *sel,idx_t offset_lists_indices,
               vector<duckdb::LogicalType,_true> *types,
               vector<duckdb::LogicalType,_true> *payload_types,Vector *payload_vector,
               LocalSortState *param_7,bool *data_to_sort,Vector *lists_indices)

{
  reference pvVar1;
  DataChunk payload_chunk;
  Vector slice;
  DataChunk DStack_108;
  DataChunk local_c8;
  Vector local_88;
  
  Vector::Vector(&local_88,child_vector,sel,offset_lists_indices);
  DataChunk::DataChunk(&DStack_108);
  DataChunk::InitializeEmpty(&DStack_108,types);
  pvVar1 = vector<duckdb::Vector,_true>::operator[](&DStack_108.data,0);
  Vector::Reference(pvVar1,lists_indices);
  pvVar1 = vector<duckdb::Vector,_true>::operator[](&DStack_108.data,1);
  Vector::Reference(pvVar1,&local_88);
  DStack_108.count = offset_lists_indices;
  DataChunk::DataChunk(&local_c8);
  DataChunk::InitializeEmpty(&local_c8,payload_types);
  pvVar1 = vector<duckdb::Vector,_true>::operator[](&local_c8.data,0);
  Vector::Reference(pvVar1,payload_vector);
  local_c8.count = offset_lists_indices;
  DataChunk::Verify(&DStack_108);
  DataChunk::Verify(&local_c8);
  DataChunk::Flatten(&DStack_108);
  LocalSortState::SinkChunk(param_7,&DStack_108,&local_c8);
  *data_to_sort = true;
  DataChunk::~DataChunk(&local_c8);
  DataChunk::~DataChunk(&DStack_108);
  if (local_88.auxiliary.internal.
      super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_88.auxiliary.internal.
               super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_88.buffer.internal.super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_88.buffer.internal.
               super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_88.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_88.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  LogicalType::~LogicalType(&local_88.type);
  return;
}

Assistant:

void SinkDataChunk(Vector *child_vector, SelectionVector &sel, idx_t offset_lists_indices, vector<LogicalType> &types,
                   vector<LogicalType> &payload_types, Vector &payload_vector, LocalSortState &local_sort_state,
                   bool &data_to_sort, Vector &lists_indices) {

	// slice the child vector
	Vector slice(*child_vector, sel, offset_lists_indices);

	// initialize and fill key_chunk
	DataChunk key_chunk;
	key_chunk.InitializeEmpty(types);
	key_chunk.data[0].Reference(lists_indices);
	key_chunk.data[1].Reference(slice);
	key_chunk.SetCardinality(offset_lists_indices);

	// initialize and fill key_chunk and payload_chunk
	DataChunk payload_chunk;
	payload_chunk.InitializeEmpty(payload_types);
	payload_chunk.data[0].Reference(payload_vector);
	payload_chunk.SetCardinality(offset_lists_indices);

	key_chunk.Verify();
	payload_chunk.Verify();

	// sink
	key_chunk.Flatten();
	local_sort_state.SinkChunk(key_chunk, payload_chunk);
	data_to_sort = true;
}